

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O0

Token * __thiscall wabt::WastLexer::GetStringToken(Token *__return_storage_ptr__,WastLexer *this)

{
  char *pcVar1;
  Location loc;
  Location loc_00;
  bool bVar2;
  int iVar3;
  undefined8 in_R9;
  Location local_b0;
  Location local_90;
  Enum local_6c;
  uint local_68;
  uint local_64;
  uint32_t scalar_value;
  uint32_t digit;
  Location local_40;
  byte local_1a;
  byte local_19;
  bool in_string;
  char *pcStack_18;
  bool has_error;
  char *saved_token_start;
  WastLexer *this_local;
  
  pcStack_18 = this->token_start_;
  local_19 = 0;
  local_1a = 1;
  saved_token_start = (char *)this;
  ReadChar(this);
LAB_00176a0d:
  do {
    while( true ) {
      while( true ) {
        if ((local_1a & 1) == 0) {
          this->token_start_ = pcStack_18;
          if ((local_19 & 1) == 0) {
            TextToken(__return_storage_ptr__,this,Text,0);
          }
          else {
            GetLocation(&local_b0,this);
            loc_00.filename._M_str = local_b0.filename._M_str;
            loc_00.filename._M_len = local_b0.filename._M_len;
            loc_00.field_1.field_1.offset = local_b0.field_1.field_1.offset;
            loc_00.field_1._8_8_ = local_b0.field_1._8_8_;
            Token::Token(__return_storage_ptr__,loc_00,First);
          }
          return __return_storage_ptr__;
        }
        iVar3 = ReadChar(this);
        if (iVar3 == -1) {
          BareToken(__return_storage_ptr__,this,Eof);
          return __return_storage_ptr__;
        }
        if (iVar3 != 10) break;
        this->token_start_ = this->cursor_ + -1;
        GetLocation(&local_40,this);
        Error(this,0x29944e);
        local_19 = 1;
        Newline(this);
      }
      if (iVar3 != 0x22) break;
      iVar3 = PeekChar(this);
      if (iVar3 == 0x22) {
        GetLocation((Location *)&scalar_value,this);
        Error(this,0x299460);
        local_19 = 1;
      }
      local_1a = 0;
    }
  } while (iVar3 != 0x5c);
  iVar3 = ReadChar(this);
  switch(iVar3) {
  case 0x22:
  case 0x27:
  case 0x5c:
  case 0x6e:
  case 0x72:
  case 0x74:
    goto LAB_00176a0d;
  default:
    this->token_start_ = this->cursor_ + -2;
    goto LAB_00176cb7;
  case 0x30:
  case 0x31:
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x41:
  case 0x42:
  case 0x43:
  case 0x44:
  case 0x45:
  case 0x46:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
    goto switchD_00176b8c_caseD_30;
  case 0x75:
    break;
  }
  this->token_start_ = this->cursor_ + -2;
  iVar3 = ReadChar(this);
  if (iVar3 == 0x7b) {
    local_68 = 0;
    do {
      iVar3 = PeekChar(this);
      bVar2 = IsHexDigit(iVar3);
      if (!bVar2) {
        iVar3 = PeekChar(this);
        if (iVar3 == 0x7d) {
          if (((local_68 < 0xd800) || (0xdfff < local_68)) &&
             (this->token_start_ != this->cursor_ + -3)) goto LAB_00176a0d;
          ReadChar(this);
        }
        break;
      }
      pcVar1 = this->cursor_;
      this->cursor_ = pcVar1 + 1;
      local_6c = (Enum)ParseHexdigit(*pcVar1,&local_64);
      local_68 = local_68 << 4 | local_64;
    } while (local_68 < 0x110000);
  }
  goto LAB_00176cb7;
switchD_00176b8c_caseD_30:
  iVar3 = PeekChar(this);
  bVar2 = IsHexDigit(iVar3);
  if (bVar2) {
    ReadChar(this);
    goto LAB_00176a0d;
  }
  this->token_start_ = this->cursor_ + -2;
LAB_00176cb7:
  GetLocation(&local_90,this);
  loc.filename._M_str = local_90.filename._M_str;
  loc.filename._M_len = local_90.filename._M_len;
  loc.field_1.field_1.offset = local_90.field_1.field_1.offset;
  loc.field_1._8_8_ = local_90.field_1._8_8_;
  Error(this,loc,"bad escape \"%.*s\"",(ulong)(uint)((int)this->cursor_ - (int)this->token_start_),
        this->token_start_,local_90.field_1.field_1.offset,in_R9);
  local_19 = 1;
  goto LAB_00176a0d;
}

Assistant:

Token WastLexer::GetStringToken() {
  const char* saved_token_start = token_start_;
  bool has_error = false;
  bool in_string = true;
  ReadChar();
  while (in_string) {
    switch (ReadChar()) {
      case kEof:
        return BareToken(TokenType::Eof);

      case '\n':
        token_start_ = cursor_ - 1;
        ERROR("newline in string");
        has_error = true;
        Newline();
        continue;

      case '"':
        if (PeekChar() == '"') {
          ERROR("invalid string token");
          has_error = true;
        }
        in_string = false;
        break;

      case '\\': {
        switch (ReadChar()) {
          case 't':
          case 'n':
          case 'r':
          case '"':
          case '\'':
          case '\\':
            // Valid escape.
            break;

          case '0':
          case '1':
          case '2':
          case '3':
          case '4':
          case '5':
          case '6':
          case '7':
          case '8':
          case '9':
          case 'a':
          case 'b':
          case 'c':
          case 'd':
          case 'e':
          case 'f':
          case 'A':
          case 'B':
          case 'C':
          case 'D':
          case 'E':
          case 'F':  // Hex byte escape.
            if (IsHexDigit(PeekChar())) {
              ReadChar();
            } else {
              token_start_ = cursor_ - 2;
              goto error;
            }
            break;

          case 'u': {
            token_start_ = cursor_ - 2;
            if (ReadChar() != '{') {
              goto error;
            }

            // Value must be a valid unicode scalar value.
            uint32_t digit;
            uint32_t scalar_value = 0;

            while (IsHexDigit(PeekChar())) {
              ParseHexdigit(*cursor_++, &digit);

              scalar_value = (scalar_value << 4) | digit;
              // Maximum value of a unicode code point.
              if (scalar_value >= 0x110000) {
                goto error;
              }
            }

            if (PeekChar() != '}') {
              goto error;
            }

            // Scalars between 0xd800 and 0xdfff are not allowed.
            if ((scalar_value >= 0xd800 && scalar_value < 0xe000) ||
                token_start_ == cursor_ - 3) {
              ReadChar();
              goto error;
            }
            break;
          }

          default:
            token_start_ = cursor_ - 2;
            goto error;

          error:
            ERROR("bad escape \"%.*s\"",
                  static_cast<int>(cursor_ - token_start_), token_start_);
            has_error = true;
            break;
        }
        break;
      }
    }
  }
  token_start_ = saved_token_start;
  if (has_error) {
    return Token(GetLocation(), TokenType::Invalid);
  }

  return TextToken(TokenType::Text);
}